

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O3

void __thiscall helics::Publication::publish(Publication *this,bool val)

{
  ValueFederate *pVVar1;
  char *pcVar2;
  bool bVar3;
  undefined7 in_register_00000031;
  char *in_R8;
  char *pcVar4;
  string_view val_00;
  string_view val_01;
  SmallBuffer db;
  undefined1 local_b0 [64];
  size_t local_70;
  byte *local_60;
  bool local_58;
  bool local_56;
  data_view local_50;
  
  pVVar1 = this->fed;
  pcVar2 = "+0";
  pcVar4 = "+0";
  if ((int)CONCAT71(in_register_00000031,val) != 0) {
    pcVar4 = "*1";
  }
  pcVar4 = pcVar4 + 1;
  if (this->changeDetectionEnabled == true) {
    val_00._M_str = pcVar4;
    val_00._M_len = 1;
    bVar3 = changeDetected(&this->prevValue,val_00,this->delta);
    if (!bVar3) {
      return;
    }
    local_b0._0_8_ = local_b0 + 0x10;
    if (val) {
      pcVar2 = "*1";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar4,pcVar2 + 2);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    val_01._M_str = in_R8;
    val_01._M_len = (size_t)pcVar4;
    typeConvert((SmallBuffer *)local_b0,(helics *)(ulong)(uint)this->pubType,HELICS_DOUBLE,val_01);
    local_50.dblock._M_len = local_70;
    local_50.dblock._M_str = (char *)local_60;
    local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_50);
    if (local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((local_56 == true) && (local_58 == false)) && (local_60 != (byte *)0x0)) {
      operator_delete__(local_60);
    }
  }
  return;
}

Assistant:

void Publication::publish(bool val)
{
    bool doPublish = (fed != nullptr);
    std::string_view bstring = val ? "1" : "0";
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, bstring, delta)) {
            prevValue = std::string(bstring);
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, bstring);
        fed->publishBytes(*this, db);
    }
}